

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O2

CharSetNode * __thiscall
UnifiedRegex::CharSetInner::Set
          (CharSetInner *this,ArenaAllocator *allocator,uint level,uint l,uint h)

{
  code *pcVar1;
  char cVar2;
  long lVar3;
  bool bVar4;
  int iVar5;
  undefined4 *puVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar7;
  CharSetNode *pCVar8;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined **ppuVar9;
  byte bVar10;
  uint uVar11;
  uint level_00;
  uint uVar13;
  ulong uVar15;
  ulong uVar12;
  ulong uVar14;
  
  if (level == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x1b1,"(level > 0)","level > 0");
    if (!bVar4) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  bVar10 = (char)level * '\x04' + 4;
  uVar11 = l >> (bVar10 & 0x1f) & 0xf;
  uVar12 = (ulong)uVar11;
  level_00 = level - 1;
  uVar14 = (ulong)level_00;
  uVar13 = h >> (bVar10 & 0x1f) & 0xf;
  pCVar8 = this->children[uVar12];
  bVar4 = pCVar8 != (CharSetNode *)0x0;
  if (uVar11 == uVar13) {
    if (pCVar8 == (CharSetNode *)0x0) {
      uVar11 = -1 << ((char)level_00 * '\x04' + 8U & 0x1f);
      if (((~uVar11 & l) != 0) || ((uVar11 | 0xffffffe - h) != 0xffffffff)) {
        pCVar8 = CharSetNode::For(allocator,level_00);
        this->children[uVar12] = pCVar8;
        iVar5 = (*pCVar8->_vptr_CharSetNode[2])(pCVar8,allocator,(ulong)level_00,(ulong)l,(ulong)h);
        this->children[uVar12] = (CharSetNode *)CONCAT44(extraout_var_02,iVar5);
        return &this->super_CharSetNode;
      }
      ppuVar9 = &CharSetFull::Instance;
    }
    else {
      iVar5 = (*pCVar8->_vptr_CharSetNode[2])(pCVar8,allocator,uVar14,(ulong)l,(ulong)h);
      ppuVar9 = (undefined **)CONCAT44(extraout_var,iVar5);
    }
    this->children[uVar12] = (CharSetNode *)ppuVar9;
    goto LAB_00cd779b;
  }
  cVar2 = (char)level_00 * '\x04';
  uVar11 = ~(-1 << (cVar2 + 8U & 0x1f));
  if (pCVar8 == (CharSetNode *)0x0) {
    if ((uVar11 & l) != 0) {
      pCVar8 = CharSetNode::For(allocator,level_00);
      this->children[uVar12] = pCVar8;
      goto LAB_00cd771e;
    }
    bVar4 = true;
    ppuVar9 = &CharSetFull::Instance;
  }
  else {
LAB_00cd771e:
    iVar5 = (*pCVar8->_vptr_CharSetNode[2])(pCVar8,allocator,uVar14,(ulong)l,(ulong)uVar11);
    ppuVar9 = (undefined **)CONCAT44(extraout_var_00,iVar5);
  }
  this->children[uVar12] = (CharSetNode *)ppuVar9;
  uVar15 = (ulong)uVar13;
  ppuVar9 = &CharSetFull::Instance;
  while (uVar12 + 1 < uVar15) {
    pCVar8 = this->children[uVar12 + 1];
    if (pCVar8 != (CharSetNode *)0x0) {
      (**pCVar8->_vptr_CharSetNode)(pCVar8,allocator);
    }
    this->children[uVar12 + 1] = (CharSetNode *)&CharSetFull::Instance;
    uVar12 = uVar12 + 1;
  }
  pCVar8 = this->children[uVar15];
  if (pCVar8 == (CharSetNode *)0x0) {
    if ((0xffffffe - h | -1 << (cVar2 + 8U & 0x1f)) != 0xffffffff) {
      pCVar8 = CharSetNode::For(allocator,level_00);
      this->children[uVar15] = pCVar8;
      iVar5 = (*pCVar8->_vptr_CharSetNode[2])(pCVar8,allocator,uVar14,0,(ulong)h);
      this->children[uVar15] = (CharSetNode *)CONCAT44(extraout_var_03,iVar5);
      return &this->super_CharSetNode;
    }
  }
  else {
    iVar5 = (*pCVar8->_vptr_CharSetNode[2])(pCVar8,allocator,uVar14,0,(ulong)h);
    ppuVar9 = (undefined **)CONCAT44(extraout_var_01,iVar5);
  }
  this->children[uVar15] = (CharSetNode *)ppuVar9;
  if (!bVar4) {
    return &this->super_CharSetNode;
  }
LAB_00cd779b:
  lVar7 = 1;
  do {
    if (lVar7 == 0x11) {
      FreeSelf(this,allocator);
      return (CharSetNode *)&CharSetFull::Instance;
    }
    lVar3 = lVar7 + -1;
    lVar7 = lVar7 + 1;
  } while (this->children[lVar3] == (CharSetNode *)&CharSetFull::Instance);
  return &this->super_CharSetNode;
}

Assistant:

CharSetNode* CharSetInner::Set(ArenaAllocator* allocator, uint level, uint l, uint h)
    {
        Assert(level > 0);
        uint li = innerIdx(level, l);
        uint hi = innerIdx(level--, h);
        bool couldBeFull = true;
        if (li == hi)
        {
            if (children[li] == nullptr)
            {
                if (remain(level, l) == 0 && remain(level, h + 1) == 0)
                    children[li] = CharSetFull::TheFullNode;
                else
                {
                    children[li] = For(allocator, level);
                    children[li] = children[li]->Set(allocator, level, l, h);
                    couldBeFull = false;
                }
            }
            else
                children[li] = children[li]->Set(allocator, level, l, h);
        }
        else
        {
            if (children[li] == nullptr)
            {
                if (remain(level, l) == 0)
                    children[li] = CharSetFull::TheFullNode;
                else
                {
                    children[li] = For(allocator, level);
                    children[li] = children[li]->Set(allocator, level, l, lim(level));
                    couldBeFull = false;
                }
            }
            else
                children[li] = children[li]->Set(allocator, level, l, lim(level));
            for (uint i = li + 1; i < hi; i++)
            {
                if (children[i] != nullptr)
                    children[i]->FreeSelf(allocator);
                children[i] = CharSetFull::TheFullNode;
            }
            if (children[hi] == nullptr)
            {
                if (remain(level, h + 1) == 0)
                    children[hi] = CharSetFull::TheFullNode;
                else
                {
                    children[hi] = For(allocator, level);
                    children[hi] = children[hi]->Set(allocator, level, 0, h);
                    couldBeFull = false;
                }
            }
            else
                children[hi] = children[hi]->Set(allocator, level, 0, h);
        }
        if (couldBeFull)
        {
            for (uint i = 0; i < branchingPerInnerLevel; i++)
            {
                if (children[i] != CharSetFull::TheFullNode)
                    return this;
            }
            FreeSelf(allocator);
            return CharSetFull::TheFullNode;
        }
        else
            return this;
    }